

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

void resizestack(lua_State *L,MSize n)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  void *p;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  uVar6 = (ulong)(L->glref).ptr32;
  p = (void *)(ulong)(L->stack).ptr32;
  uVar9 = L->stacksize;
  uVar8 = (ulong)uVar9;
  uVar2 = *(undefined4 *)(uVar6 + 0x160);
  *(undefined4 *)(uVar6 + 0x160) = 0xffffffff;
  uVar12 = n + 6;
  pvVar7 = lj_mem_realloc(L,p,uVar9 * 8,n * 8 + 0x30);
  (L->stack).ptr32 = (uint32_t)pvVar7;
  (L->maxstack).ptr32 = (uint32_t)pvVar7 + n * 8;
  auVar5 = _DAT_0015e500;
  auVar4 = _DAT_0015d420;
  auVar3 = _DAT_0015d410;
  uVar6 = uVar8;
  if (uVar9 < uVar12) {
    uVar6 = (ulong)uVar12;
    lVar10 = (uVar6 - uVar8) + -1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar11 = 0;
    auVar13 = auVar13 ^ _DAT_0015d420;
    do {
      auVar15._8_4_ = (int)uVar11;
      auVar15._0_8_ = uVar11;
      auVar15._12_4_ = (int)(uVar11 >> 0x20);
      auVar16 = (auVar15 | auVar3) ^ auVar4;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar7 + uVar11 * 8 + uVar8 * 8 + 4) = 0xffffffff;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)pvVar7 + uVar11 * 8 + uVar8 * 8 + 0xc) = 0xffffffff;
      }
      auVar15 = (auVar15 | auVar5) ^ auVar4;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)pvVar7 + uVar11 * 8 + uVar8 * 8 + 0x14) = 0xffffffff;
        *(undefined4 *)((long)pvVar7 + uVar11 * 8 + uVar8 * 8 + 0x1c) = 0xffffffff;
      }
      uVar11 = uVar11 + 4;
    } while (((uVar6 - uVar8) + 3 & 0xfffffffffffffffc) != uVar11);
  }
  lVar10 = (long)pvVar7 - (long)p;
  L->stacksize = uVar12;
  uVar8 = (ulong)(L->glref).ptr32;
  if ((ulong)*(uint *)(uVar8 + 400) - (long)p < uVar6) {
    *(uint *)(uVar8 + 400) = *(uint *)(uVar8 + 400) + (int)lVar10;
  }
  L->base = (TValue *)((long)L->base + lVar10);
  L->top = (TValue *)((long)L->top + lVar10);
  uVar9 = (L->openupval).gcptr32;
  if (uVar9 != 0) {
    do {
      puVar1 = (uint *)(ulong)uVar9 + 4;
      *puVar1 = *puVar1 + (int)lVar10;
      uVar9 = *(uint *)(ulong)uVar9;
    } while (uVar9 != 0);
    uVar8 = (ulong)(L->glref).ptr32;
  }
  *(undefined4 *)(uVar8 + 0x160) = uVar2;
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  int32_t oldvmstate = G(L)->vmstate;

  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");

  /*
  ** Lua stack is inconsistent while reallocation, profilers
  ** depend on vmstate during reports, so set vmstate to INTERP
  ** to avoid inconsistent behaviour.
  */
  setvmstate(G(L), INTERP);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));

  G(L)->vmstate = oldvmstate;
}